

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O0

size_t __thiscall Jupiter::DataBuffer::shrink(DataBuffer *this)

{
  size_t sVar1;
  uint8_t *puVar2;
  DataBuffer *this_local;
  
  sVar1 = size(this);
  this->bufferSize = sVar1;
  if (this->base != this->head) {
    memmove(this->base,this->head,this->bufferSize);
  }
  puVar2 = (uint8_t *)realloc(this->base,this->bufferSize);
  this->base = puVar2;
  this->head = this->base;
  this->end = this->head + this->bufferSize;
  return this->bufferSize;
}

Assistant:

size_t Jupiter::DataBuffer::shrink() {
	Jupiter::DataBuffer::bufferSize = Jupiter::DataBuffer::size();

	if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
		memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, Jupiter::DataBuffer::bufferSize);

	Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, Jupiter::DataBuffer::bufferSize));
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + Jupiter::DataBuffer::bufferSize;
	return Jupiter::DataBuffer::bufferSize;
}